

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void getPart(char *attrName,int argc,char **argv,int *i,int *part)

{
  int iVar1;
  invalid_argument *this;
  long lVar2;
  int *in_RCX;
  long in_RDX;
  int in_ESI;
  undefined4 *in_R8;
  
  if (in_ESI + -2 < *in_RCX) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Expected a part number (or \"any\")");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  iVar1 = strcmp(*(char **)(in_RDX + (long)(*in_RCX + 1) * 8),"any");
  if (iVar1 == 0) {
    *in_R8 = 0xffffffff;
  }
  else {
    lVar2 = strtol(*(char **)(in_RDX + (long)(*in_RCX + 1) * 8),(char **)0x0,0);
    *in_R8 = (int)lVar2;
  }
  *in_RCX = *in_RCX + 2;
  return;
}

Assistant:

void
getPart (const char attrName[], int argc, char** argv, int& i, int& part)
{
    if (i > argc - 2)
        throw invalid_argument ("Expected a part number (or \"any\")");

    if (!strcmp (argv[i + 1], "any"))
        part = -1;
    else
        part = strtol (argv[i + 1], 0, 0);

    i += 2;
}